

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort_par.hpp
# Opt level: O0

void burst::
     radix_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::identity_fn,burst::low_byte_fn>
               (parallel_policy par,
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     last,identity_fn *buffer)

{
  const_reference pvVar1;
  identity_fn *r;
  shift_to_unsigned_fn *l;
  undefined1 local_80 [8];
  thread_pool pool;
  value_type_conflict1 thread_count;
  undefined1 local_40 [8];
  array<unsigned_long,_2UL> shape;
  uchar *buffer_local;
  uchar *last_local;
  uchar *first_local;
  parallel_policy par_local;
  
  r = buffer;
  _local_40 = detail::
              get_shape<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        (par,first,last);
  pvVar1 = std::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_40,0);
  pool.num_threads_.super___atomic_base<long>._M_i = (__atomic_base<long>)*pvVar1;
  if ((ulong)pool.num_threads_.super___atomic_base<long>._M_i < 2) {
    radix_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::identity_fn,burst::low_byte_fn>
              (first._M_current,last._M_current,buffer);
  }
  else {
    boost::asio::thread_pool::thread_pool
              ((thread_pool *)local_80,(size_t)pool.num_threads_.super___atomic_base<long>._M_i);
    compose<burst::shift_to_unsigned_fn_const&,burst::identity_fn>
              ((compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> *)&shift_to_unsigned,
               (burst *)((long)shape._M_elems + 0xf),l,r);
    detail::
    radix_sort_impl<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn>
              ((thread_pool *)local_80,local_40,first._M_current,last._M_current,buffer);
    boost::asio::thread_pool::~thread_pool((thread_pool *)local_80);
  }
  return;
}

Assistant:

void
        radix_sort
        (
            parallel_policy par,
            RandomAccessIterator1 first,
            RandomAccessIterator1 last,
            RandomAccessIterator2 buffer,
            Map map,
            Radix radix
        )
    {
        const auto shape = detail::get_shape(par, first, last);
        const auto thread_count = shape[0];
        if (thread_count > 1)
        {
            boost::asio::thread_pool pool(thread_count);
            detail::radix_sort_impl
            (
                pool,
                shape,
                first,
                last,
                buffer,
                compose(shift_to_unsigned, std::move(map)),
                radix
            );
        }
        else
        {
            radix_sort(first, last, buffer, map, radix);
        }
    }